

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O3

string * Hpipe::anon_unknown_21::left_shifted(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  istream *piVar4;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  long *plVar11;
  ulong uVar12;
  string line;
  istringstream ss;
  long *local_210;
  long local_200;
  long lStack_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  long *local_1d0 [2];
  long local_1c0 [2];
  long local_1b0 [15];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)str,_S_in);
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = 0;
  uVar12 = 1000000;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                            (char)(istringstream *)local_1b0);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_1f0,cVar3);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    uVar5 = std::__cxx11::string::find_first_not_of((char)(string *)&local_1f0,0x20);
    uVar9 = uVar12;
    if (uVar5 < uVar12) {
      uVar9 = uVar5;
    }
    if (uVar5 != 0xffffffffffffffff) {
      uVar12 = uVar9;
    }
  }
  if (uVar12 == 1000000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  else {
    std::ios::clear((int)(istringstream *)local_1b0 + (int)*(undefined8 *)(local_1b0[0] + -0x18));
    std::istream::seekg((istream *)local_1b0,0,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                              (char)(istream *)local_1b0);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_1f0,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      lVar7 = std::__cxx11::string::find_first_not_of((char)(string *)&local_1f0,0x20);
      if (lVar7 != -1) {
        sVar2 = __return_storage_ptr__->_M_string_length;
        std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_1f0);
        pcVar10 = "";
        if (sVar2 != 0) {
          pcVar10 = "\n";
        }
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_1d0,0,(char *)0x0,(ulong)pcVar10);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_200 = *plVar11;
          lStack_1f8 = plVar8[3];
          local_210 = &local_200;
        }
        else {
          local_200 = *plVar11;
          local_210 = (long *)*plVar8;
        }
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_210);
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
      }
    }
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  psVar6 = (string *)std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

std::string left_shifted( const std::string &str ) {
    std::string::size_type min_pos = 1e6;
    std::istringstream ss( str );
    std::string line;
    while( std::getline( ss, line ) ) {
        auto pos = line.find_first_not_of( ' ' );
        if ( pos != std::string::npos )
            min_pos = std::min( min_pos, pos );
    }
    if ( min_pos == 1e6 )
        return str;

    ss.clear();
    ss.seekg( 0 );
    std::string res;
    while( std::getline( ss, line ) ) {
        if ( line.find_first_not_of( ' ' ) != std::string::npos )
            res += ( res.size() ? "\n" : "" ) + line.substr( min_pos );
    }
    return res;
}